

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void convolve_horiz(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                   InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h)

{
  uint8_t uVar1;
  int iVar2;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int in_stack_00000008;
  int sum;
  int16_t *x_filter;
  uint8_t *src_x;
  int x;
  int x_q4;
  int y;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_8 = in_RDI + -3;
  for (local_30 = 0; local_30 < (int)src_x; local_30 = local_30 + 1) {
    local_34 = in_R9D;
    for (local_38 = 0; local_38 < (int)x_filter; local_38 = local_38 + 1) {
      iVar2 = horz_scalar_product((uint8_t *)(local_8 + ((int)local_34 >> 4)),
                                  (int16_t *)(in_R8 + (long)(int)(local_34 & 0xf) * 0x10));
      uVar1 = clip_pixel(iVar2 + 0x40 >> 7);
      *(uint8_t *)(local_18 + local_38) = uVar1;
      local_34 = in_stack_00000008 + local_34;
    }
    local_8 = in_RSI + local_8;
    local_18 = in_RCX + local_18;
  }
  return;
}

Assistant:

static void convolve_horiz(const uint8_t *src, ptrdiff_t src_stride,
                           uint8_t *dst, ptrdiff_t dst_stride,
                           const InterpKernel *x_filters, int x0_q4,
                           int x_step_q4, int w, int h) {
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int sum = horz_scalar_product(src_x, x_filter);
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}